

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O1

Program __thiscall DeadCodeElimination::run(DeadCodeElimination *this,Program *program)

{
  mapped_type pFVar1;
  Function *this_00;
  mapped_type *ppFVar2;
  Function *extraout_RDX;
  Function *pFVar3;
  Program PVar4;
  Function *function_1;
  Function *function;
  FunctionTable function_table;
  Function *local_a8;
  _Rb_tree<const_Expression_*,_std::pair<const_Expression_*const,_bool>,_std::_Select1st<std::pair<const_Expression_*const,_bool>_>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_bool>_>_>
  local_a0;
  Mark local_70;
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Function_*>,_std::_Select1st<std::pair<const_Function_*const,_Function_*>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  local_60;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pFVar3 = program->first;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pFVar3 != (Function *)0x0) {
    do {
      local_a0._M_impl._0_8_ = pFVar3;
      this_00 = (Function *)operator_new(0x60);
      Function::Function(this_00,&pFVar3->argument_types,pFVar3->return_type);
      if (*(long *)this == 0) {
        *(Function **)this = this_00;
      }
      if (*(long *)(this + 8) != 0) {
        *(Function **)(*(long *)(this + 8) + 0x58) = this_00;
      }
      *(Function **)(this + 8) = this_00;
      ppFVar2 = std::
                map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                              *)&local_60,(key_type *)&local_a0);
      *ppFVar2 = this_00;
      pFVar3 = pFVar3->next_function;
    } while (pFVar3 != (Function *)0x0);
  }
  pFVar3 = program->first;
  if (pFVar3 != (Function *)0x0) {
    do {
      local_a8 = pFVar3;
      ppFVar2 = std::
                map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                              *)&local_60,&local_a8);
      pFVar1 = *ppFVar2;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_a0 + 8);
      local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_70.super_Visitor<void>._vptr_Visitor = (_func_int **)&PTR_visit_int_literal_00154300;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      local_70.usage_table = (UsageTable *)&local_a0;
      Mark::mark(&local_70,(local_a8->block).last);
      Sweep::evaluate((FunctionTable *)&local_60,(UsageTable *)&local_a0,&pFVar1->block,
                      &local_a8->block);
      std::
      _Rb_tree<const_Expression_*,_std::pair<const_Expression_*const,_bool>,_std::_Select1st<std::pair<const_Expression_*const,_bool>_>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_bool>_>_>
      ::~_Rb_tree(&local_a0);
      pFVar3 = pFVar3->next_function;
    } while (pFVar3 != (Function *)0x0);
  }
  std::
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Function_*>,_std::_Select1st<std::pair<const_Function_*const,_Function_*>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  ::~_Rb_tree(&local_60);
  PVar4.last = extraout_RDX;
  PVar4.first = (Function *)this;
  return PVar4;
}

Assistant:

static Program run(const Program& program) {
		Program new_program;
		FunctionTable function_table;
		for (const Function* function: program) {
			Function* new_function = new Function(function->get_argument_types(), function->get_return_type());
			new_program.add_function(new_function);
			function_table[function] = new_function;
		}
		for (const Function* function: program) {
			Function* new_function = function_table[function];
			UsageTable usage_table;
			Mark::evaluate(usage_table, function->get_block());
			Sweep::evaluate(function_table, usage_table, new_function->get_block(), function->get_block());
		}
		return new_program;
	}